

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.cpp
# Opt level: O0

void diy::mpi::detail::get
               (DIY_MPI_Win *win,void *data,int count,datatype *type,int rank,uint offset)

{
  MPI_Datatype poVar1;
  MPI_Datatype poVar2;
  MPI_Datatype *ppoVar3;
  MPI_Win *ppoVar4;
  DIY_MPI_Datatype *in_RCX;
  undefined4 in_EDX;
  undefined8 in_RSI;
  DIY_MPI_Win *in_RDI;
  undefined4 in_R8D;
  undefined4 in_R9D;
  
  ppoVar3 = mpi_cast(in_RCX);
  poVar1 = *ppoVar3;
  ppoVar3 = mpi_cast(in_RCX);
  poVar2 = *ppoVar3;
  ppoVar4 = mpi_cast(in_RDI);
  MPI_Get(in_RSI,in_EDX,poVar1,in_R8D,in_R9D,in_EDX,poVar2,*ppoVar4);
  return;
}

Assistant:

void get(const DIY_MPI_Win& win, void* data, int count, const datatype& type, int rank, unsigned offset)
{
#if DIY_HAS_MPI
  MPI_Get(data, count, mpi_cast(type.handle), rank, offset, count, mpi_cast(type.handle), mpi_cast(win));
#else
  const void* buffer = mpi_cast(win).data();
  size_t size = mpi_cast(type.handle);
  std::copy_n(static_cast<const int8_t*>(buffer) + (offset * size),
              size * static_cast<size_t>(count),
              static_cast<int8_t*>(data));
  (void)rank;
#endif
}